

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O3

bool __thiscall QTextFragment::contains(QTextFragment *this,int position)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  
  bVar1 = false;
  if ((this->p != (QTextDocumentPrivate *)0x0) && (bVar1 = false, this->n != 0)) {
    iVar2 = QTextFragment::position(this);
    if (position < iVar2) {
      bVar1 = false;
    }
    else {
      iVar3 = length(this);
      bVar1 = position < iVar3 + iVar2;
    }
  }
  return bVar1;
}

Assistant:

bool QTextFragment::contains(int position) const
{
    if (!p || !n)
        return false;
    int pos = this->position();
    return position >= pos && position < pos + length();
}